

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,unsigned_char,7ul,date::characters_t<char,3ul>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_unsigned_char,_7UL> *fmt,characters_t<char,_3UL> *others)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  pair<date::static_string<char,_4UL>,_unsigned_char> *ppVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  array<bool,_7UL> is_match;
  array<const_char_*,_7UL> str_list;
  char local_77 [7];
  characters_t<char,_3UL> *local_70;
  long alStack_68 [7];
  
  local_70 = others;
  ppVar5 = fmt->aliases->_M_elems;
  lVar6 = 0;
  do {
    alStack_68[lVar6] = (long)ppVar5;
    local_77[lVar6] =
         (((pair<date::static_string<char,_4UL>,_unsigned_char> *)&ppVar5->first)->first).m_length
         != 0;
    lVar6 = lVar6 + 1;
    ppVar5 = ppVar5 + 1;
  } while (lVar6 != 7);
  bVar9 = true;
  uVar8 = 0;
  while (end->m_position != pos->m_position) {
    cVar2 = pos->m_cache[pos->m_position];
    lVar7 = 2;
    lVar6 = 0;
    do {
      if (local_77[lVar6] == '\x01') {
        pcVar3 = (char *)alStack_68[lVar6];
        if (*pcVar3 == cVar2) {
          if (pcVar3[1] == '\0') {
            iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
                      (pos);
            *fmt->value = (&fmt->aliases->_M_elems[0].first.m_data)[lVar7 * 2]._M_elems[0];
            bVar4 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,3ul>
                              (pos,end,local_70);
            goto LAB_00107c7f;
          }
          alStack_68[lVar6] = (long)(pcVar3 + 1);
        }
        else {
          local_77[lVar6] = '\0';
        }
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 3;
    } while (lVar7 != 0x17);
    uVar1 = uVar8 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    bVar9 = uVar8 < 3;
    uVar8 = uVar1;
    if (uVar1 == 4) break;
  }
  bVar4 = false;
LAB_00107c7f:
  return (bool)(bVar9 & bVar4);
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}